

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

uint32_t create_pixel(Display *dpy,uint8_t red,uint8_t green,uint8_t blue)

{
  undefined8 uVar1;
  int iVar2;
  char *__nptr;
  XColor xcolour;
  uint32_t local_38;
  
  uVar1 = *(undefined8 *)(*(long *)(dpy + 0xe8) + 0x50 + (long)*(int *)(dpy + 0xe0) * 0x80);
  if (gamma_table_ready == '\0') {
    __nptr = getenv("ANGBAND_X11_GAMMA");
    if (__nptr != (char *)0x0) {
      gamma_val = atoi(__nptr);
    }
    gamma_table_ready = '\x01';
    if (gamma_val != L'\0') {
      build_gamma_table(gamma_val);
    }
  }
  if (L'\0' < gamma_val) {
    red = gamma_table[red];
    green = gamma_table[green];
    blue = gamma_table[blue];
  }
  iVar2 = XAllocColor(dpy,uVar1);
  if (iVar2 == 0) {
    quit_fmt("Couldn\'t allocate bitmap color #%04x%04x%04x\n",(ulong)(ushort)((ushort)red * 0x101),
             (ulong)(ushort)((ushort)green * 0x101),(ulong)(ushort)((ushort)blue * 0x101));
  }
  return local_38;
}

Assistant:

static uint32_t create_pixel(Display *dpy, uint8_t red, uint8_t green,
		uint8_t blue)
{
	Colormap cmap = DefaultColormapOfScreen(DefaultScreenOfDisplay(dpy));

	XColor xcolour;

	if (!gamma_table_ready) {
		const char *str = getenv("ANGBAND_X11_GAMMA");
		if (str != NULL) gamma_val = atoi(str);

		gamma_table_ready = true;

		/* Only need to build the table if gamma exists */
		if (gamma_val) build_gamma_table(gamma_val);
	}

	/* Hack -- Gamma Correction */
	if (gamma_val > 0) {
		red = gamma_table[red];
		green = gamma_table[green];
		blue = gamma_table[blue];
	}

	/* Build the color */

	xcolour.red   = red * 257;
	xcolour.green = green * 257;
	xcolour.blue  = blue * 257;
	xcolour.flags = DoRed | DoGreen | DoBlue;

	/* Attempt to Allocate the Parsed color */
	if (!(XAllocColor(dpy, cmap, &xcolour))) {
		quit_fmt("Couldn't allocate bitmap color #%04x%04x%04x\n",
			 xcolour.red, xcolour.green, xcolour.blue);
	}

	return (xcolour.pixel);
}